

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointTriface.h
# Opt level: O2

void __thiscall
chrono::fea::ChTriangleOfXYZROTnodes::~ChTriangleOfXYZROTnodes(ChTriangleOfXYZROTnodes *this)

{
  ~ChTriangleOfXYZROTnodes(this);
  ::operator_delete(this,0x38);
  return;
}

Assistant:

class ChApi ChTriangleOfXYZROTnodes : public ChVariableTupleCarrier_3vars<6, 6, 6> {
  public:
    std::shared_ptr<fea::ChNodeFEAxyzrot> mnodeB1;
    std::shared_ptr<fea::ChNodeFEAxyzrot> mnodeB2;
    std::shared_ptr<fea::ChNodeFEAxyzrot> mnodeB3;

    virtual ChVariables* GetVariables1() { return &mnodeB1->Variables(); };
    virtual ChVariables* GetVariables2() { return &mnodeB2->Variables(); };
    virtual ChVariables* GetVariables3() { return &mnodeB3->Variables(); };
}